

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void convertRGBA64PMToRGBA32F(QRgbaFloat32 *buffer,quint64 *src,int count)

{
  quint16 red;
  quint16 green;
  quint16 blue;
  quint16 alpha;
  undefined8 *puVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QRgbaFloat<float> QVar2;
  int i;
  QRgba64 *in;
  QRgba64 c;
  int local_74;
  float local_38;
  float fStack_34;
  float local_30;
  float fStack_2c;
  QRgba64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_74 = 0; local_74 < in_EDX; local_74 = local_74 + 1) {
    local_10.rgba = *(quint64 *)(in_RSI + (long)local_74 * 8);
    red = QRgba64::red(&local_10);
    green = QRgba64::green(&local_10);
    blue = QRgba64::blue(&local_10);
    alpha = QRgba64::alpha(&local_10);
    QVar2 = QRgbaFloat<float>::fromRgba64(red,green,blue,alpha);
    local_38 = QVar2.r;
    fStack_2c = QVar2.a;
    fStack_34 = QVar2.g;
    local_30 = QVar2.b;
    puVar1 = (undefined8 *)(in_RDI + (long)local_74 * 0x10);
    *puVar1 = CONCAT44(fStack_34 * fStack_2c,local_38 * fStack_2c);
    puVar1[1] = CONCAT44(fStack_2c,local_30 * fStack_2c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void QT_FASTCALL convertRGBA64PMToRGBA32F(QRgbaFloat32 *buffer, const quint64 *src, int count)
{
    const auto *in = reinterpret_cast<const QRgba64 *>(src);
    for (int i = 0; i < count; ++i) {
        auto c = in[i];
        buffer[i] = QRgbaFloat32::fromRgba64(c.red(), c.green(), c.blue(), c.alpha()).premultiplied();
    }
}